

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall ON_MaterialRef::Compare(ON_MaterialRef *this,ON_MaterialRef *other)

{
  int local_1c;
  int rc;
  ON_MaterialRef *other_local;
  ON_MaterialRef *this_local;
  
  local_1c = ON_UuidCompare(&this->m_plugin_id,&other->m_plugin_id);
  if (local_1c != 0) {
    local_1c = (uint)this->m_material_source - (uint)other->m_material_source;
  }
  if (local_1c == 0) {
    local_1c = ON_UuidCompare(&this->m_material_id,&other->m_material_id);
  }
  if (local_1c == 0) {
    local_1c = ON_UuidCompare(&this->m_material_backface_id,&other->m_material_backface_id);
  }
  return local_1c;
}

Assistant:

int ON_MaterialRef::Compare( const ON_MaterialRef& other ) const
{
  int rc = ON_UuidCompare(m_plugin_id,other.m_plugin_id);
  if (rc)
    rc = ((int)m_material_source) - ((int)other.m_material_source);
  if (!rc)
    rc = ON_UuidCompare(m_material_id,other.m_material_id);
  if (!rc)
    rc = ON_UuidCompare(m_material_backface_id,other.m_material_backface_id);
  return rc;
}